

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O2

void __thiscall
chaiscript::eval::Compiled_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>
::~Compiled_AST_Node
          (Compiled_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *this)

{
  ~Compiled_AST_Node(this);
  operator_delete(this,0x90);
  return;
}

Assistant:

Compiled_AST_Node(AST_Node_Impl_Ptr<T> t_original_node,
                        std::vector<AST_Node_Impl_Ptr<T>> t_children,
                        std::function<Boxed_Value(const std::vector<AST_Node_Impl_Ptr<T>> &, const chaiscript::detail::Dispatch_State &t_ss)> t_func)
          : AST_Node_Impl<T>(t_original_node->text, AST_Node_Type::Compiled, t_original_node->location, std::move(t_children))
          , m_func(std::move(t_func))
          , m_original_node(std::move(t_original_node)) {
      }